

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_write_attributes_uint8(void *a,uint8_t *attrib,uint32_t nr_of_attribs)

{
  int iVar1;
  char *dst;
  int iVar2;
  uint uVar3;
  uint64_t sz;
  ulong bytes_needed;
  LZ4_stream_t lz4Stream_body;
  undefined1 local_4050 [16416];
  
  iVar1 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar2 = 0;
  if (iVar1 != 0) {
    **(undefined1 **)((long)a + 8) = 0x11;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar2 = 0;
    if (iVar1 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_attribs;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      LZ4_initStream(local_4050,0x4020);
      iVar2 = 0;
      uVar3 = 0;
      if (nr_of_attribs < 0x7e000001) {
        uVar3 = (uint)((ulong)nr_of_attribs * 0x8080808081 >> 0x27) + 0x10;
      }
      dst = (char *)malloc((ulong)uVar3);
      uVar3 = LZ4_compress_default((char *)attrib,dst,nr_of_attribs,uVar3);
      iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
      if (iVar1 != 0) {
        **(uint **)((long)a + 8) = uVar3;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        bytes_needed = (ulong)uVar3;
        iVar1 = buffer_ready_for_writing((trico_archive *)a,bytes_needed);
        if (iVar1 != 0) {
          memcpy(*(void **)((long)a + 8),dst,bytes_needed);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + bytes_needed;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - bytes_needed;
          free(dst);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_write_attributes_uint8(void* a, const uint8_t* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_uint8_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0; 

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)attrib, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  return 1;
  }